

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_osd.cpp
# Opt level: O0

char * __thiscall bp_osd::bp_decode(bp_osd *this,char *synd)

{
  ostream *this_00;
  char *in_RDI;
  int *unaff_retaddr;
  int *in_stack_00000008;
  undefined4 in_stack_00000010;
  int in_stack_00000014;
  mod2sparse *in_stack_00000028;
  char *in_stack_00000030;
  mod2sparse *in_stack_00000038;
  double *in_stack_00000040;
  double *in_stack_00000050;
  
  if (*(int *)(in_RDI + 0x40) == 0) {
    bp_decode_ms(in_stack_00000028,(char *)this,(double)synd,in_stack_00000014,in_stack_00000008,
                 unaff_retaddr,in_RDI,in_stack_00000040);
  }
  else if (*(int *)(in_RDI + 0x40) == 1) {
    bp_decode_ms_min_synd
              (in_stack_00000038,in_stack_00000030,(double)in_stack_00000028,this._4_4_,(int *)synd,
               (int *)CONCAT44(in_stack_00000014,in_stack_00000010),(char *)in_stack_00000008,
               in_stack_00000050);
  }
  else if (*(int *)(in_RDI + 0x40) == 2) {
    bp_decode_ps(in_stack_00000028,(char *)this,(double)synd,in_stack_00000014,in_stack_00000008,
                 unaff_retaddr,in_RDI,in_stack_00000040);
  }
  else {
    if (*(int *)(in_RDI + 0x40) != 3) {
      this_00 = std::operator<<((ostream *)&std::cout,
                                "ERROR in <bp_osd::bp_decode>: Invalid BP_method");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      exit(0x16);
    }
    bp_decode_ps_min_synd
              (in_stack_00000038,in_stack_00000030,(double)in_stack_00000028,this._4_4_,(int *)synd,
               (int *)CONCAT44(in_stack_00000014,in_stack_00000010),(char *)in_stack_00000008,
               in_stack_00000050);
  }
  return *(char **)(in_RDI + 0x50);
}

Assistant:

char *bp_osd::bp_decode(char *synd) {

    if(bp_method==0) bp_decode_ms(H,synd,channel_prob,max_iter,converge,iter,bp_decoding,log_prob_ratios);
    else if(bp_method==1) bp_decode_ms_min_synd(H,synd,channel_prob,max_iter,converge,iter,bp_decoding,log_prob_ratios);
    else if(bp_method==2) bp_decode_ps(H,synd,channel_prob,max_iter,converge,iter,bp_decoding,log_prob_ratios);
    else if(bp_method==3) bp_decode_ps_min_synd(H,synd,channel_prob,max_iter,converge,iter,bp_decoding,log_prob_ratios);
    else{
        cout<<"ERROR in <bp_osd::bp_decode>: Invalid BP_method" <<endl;
        exit(22);
    }





    return bp_decoding;



}